

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsc.c
# Opt level: O3

int * Dsc_ComputeMatches(char *p)

{
  byte bVar1;
  long lVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  int pNested [16];
  int aiStack_48 [18];
  
  if (*p != '\0') {
    lVar2 = 0;
    piVar3 = Dsc_ComputeMatches::pMatches;
    iVar4 = 0;
    do {
      *piVar3 = 0;
      bVar1 = p[lVar2];
      uVar6 = bVar1 - 0x28;
      if (uVar6 < 0x36) {
        if ((0x8000000100001U >> ((ulong)uVar6 & 0x3f) & 1) != 0) goto LAB_00522289;
        if ((0x20000000400002U >> ((ulong)uVar6 & 0x3f) & 1) == 0) goto LAB_0052226c;
LAB_00522278:
        lVar5 = (long)iVar4;
        iVar4 = iVar4 + -1;
        Dsc_ComputeMatches::pMatches[aiStack_48[lVar5 + -1]] = (int)lVar2;
      }
      else {
LAB_0052226c:
        if (bVar1 == 0x7b) {
LAB_00522289:
          aiStack_48[iVar4] = (int)lVar2;
          if (0xe < iVar4) {
            __assert_fail("nNested < DSC_MAX_VAR",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dsc/dsc.c"
                          ,0x1ce,"int *Dsc_ComputeMatches(char *)");
          }
          iVar4 = iVar4 + 1;
        }
        else if (bVar1 == 0x7d) goto LAB_00522278;
      }
      piVar3 = piVar3 + 1;
      lVar5 = lVar2 + 1;
      lVar2 = lVar2 + 1;
    } while (p[lVar5] != '\0');
    if (iVar4 != 0) {
      __assert_fail("nNested == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dsc/dsc.c"
                    ,0x1d0,"int *Dsc_ComputeMatches(char *)");
    }
  }
  return Dsc_ComputeMatches::pMatches;
}

Assistant:

int * Dsc_ComputeMatches( char * p )
{
    static int pMatches[DSC_MAX_VAR];
    int pNested[DSC_MAX_VAR];
    int v, nNested = 0;
    for ( v = 0; p[v]; v++ )
    {
        pMatches[v] = 0;
        if ( p[v] == '(' || p[v] == '[' || p[v] == '<' || p[v] == '{' )
            pNested[nNested++] = v;
        else if ( p[v] == ')' || p[v] == ']' || p[v] == '>' || p[v] == '}' )
            pMatches[pNested[--nNested]] = v;
        assert( nNested < DSC_MAX_VAR );
    }
    assert( nNested == 0 );
    return pMatches;
}